

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_bench.cc
# Opt level: O2

void __thiscall sfc64::sfc64(sfc64 *this,uint64_t _seed)

{
  int iVar1;
  bool bVar2;
  
  this->m_a = _seed;
  this->m_b = _seed;
  this->m_c = _seed;
  this->m_counter = 1;
  iVar1 = 0xc;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    operator()(this);
  }
  return;
}

Assistant:

sfc64(uint64_t _seed)
        : m_a(_seed)
        , m_b(_seed)
        , m_c(_seed)
        , m_counter(1) {
        for (int i = 0; i < 12; ++i) {
            operator()();
        }
    }